

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall
util_tests::test_LocaleIndependentAtoi::test_method(test_LocaleIndependentAtoi *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  char cVar3;
  uchar uVar4;
  short sVar5;
  unsigned_short uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  long lVar9;
  iterator in_R8;
  iterator pvVar10;
  allocator_type *__a;
  iterator pvVar11;
  iterator in_R9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *pmVar12;
  ulong *puVar13;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  __l;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  string_view str_26;
  string_view str_27;
  string_view str_28;
  string_view str_29;
  string_view str_30;
  string_view str_31;
  string_view str_32;
  string_view str_33;
  string_view str_34;
  string_view str_35;
  string_view str_36;
  string_view str_37;
  string_view str_38;
  string_view str_39;
  string_view str_40;
  string_view str_41;
  string_view str_42;
  string_view str_43;
  string_view str_44;
  string_view str_45;
  string_view str_46;
  string_view str_47;
  string_view str_48;
  string_view str_49;
  string_view str_50;
  string_view str_51;
  string_view str_52;
  string_view str_53;
  string_view str_54;
  string_view str_55;
  string_view str_56;
  string_view str_57;
  char *local_d20;
  char *local_d18;
  undefined1 *local_d10;
  undefined1 *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char *local_ce8;
  undefined1 *local_ce0;
  undefined1 *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  undefined1 *local_bc0;
  undefined1 *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  undefined1 *local_b60;
  undefined1 *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 *local_b30;
  undefined1 *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  char *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_ad8;
  undefined1 *local_ad0;
  undefined1 *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  undefined1 *local_aa0;
  undefined1 *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char *local_a78;
  undefined1 *local_a70;
  undefined1 *local_a68;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  allocator_type local_77a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_779;
  int local_778 [4];
  long local_768 [2];
  ulong local_758;
  char *local_750;
  char *local_748;
  undefined1 *local_740;
  undefined1 *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 local_6c0 [8];
  char *local_6b8;
  _Base_ptr local_6b0;
  _Base_ptr local_6a8;
  _Base_ptr local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 *local_648;
  undefined1 *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 local_1a8 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  atoi64_test_pairs;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x2f4;
  file.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c8,msg);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d0 = "";
  str._M_str = "1234";
  str._M_len = 4;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0x4d2;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_1d8,0x2f4,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"1234\")",
             local_6c0,"1\'234");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pmVar12;
  msg_00.m_begin = pvVar10;
  file_00.m_end = (iterator)0x2f5;
  file_00.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f8,
             msg_00);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_200 = "";
  str_00._M_str = "0";
  str_00._M_len = 1;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_00);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_208,0x2f5,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"0\")",
             local_6c0,"0");
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pmVar12;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x2f6;
  file_01.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_228,
             msg_01);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_230 = "";
  str_01._M_str = "01234";
  str_01._M_len = 5;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_01);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0x4d2;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_238,0x2f6,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"01234\")",
             local_6c0,"1\'234");
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pmVar12;
  msg_02.m_begin = pvVar10;
  file_02.m_end = (iterator)0x2f7;
  file_02.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_258,
             msg_02);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_260 = "";
  str_02._M_str = "-1234";
  str_02._M_len = 5;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_02);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0xfffffb2e;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_268,0x2f7,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"-1234\")",
             local_6c0,"-1\'234");
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pmVar12;
  msg_03.m_begin = pvVar10;
  file_03.m_end = (iterator)0x2f8;
  file_03.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_288,
             msg_03);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_290 = "";
  str_03._M_str = " 1";
  str_03._M_len = 2;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_03);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_298,0x2f8,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\" 1\")",
             local_6c0,"1");
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pmVar12;
  msg_04.m_begin = pvVar10;
  file_04.m_end = (iterator)0x2f9;
  file_04.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2b8,
             msg_04);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c0 = "";
  str_04._M_str = "1 ";
  str_04._M_len = 2;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_04);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_2c8,0x2f9,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"1 \")",
             local_6c0,"1");
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pmVar12;
  msg_05.m_begin = pvVar10;
  file_05.m_end = (iterator)0x2fa;
  file_05.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2e8,
             msg_05);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2f0 = "";
  str_05._M_str = "1a";
  str_05._M_len = 2;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_05);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_2f8,0x2fa,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"1a\")",
             local_6c0,"1");
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)pmVar12;
  msg_06.m_begin = pvVar10;
  file_06.m_end = (iterator)0x2fb;
  file_06.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_318,
             msg_06);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_320 = "";
  str_06._M_str = "1.1";
  str_06._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_06);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_328,0x2fb,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"1.1\")",
             local_6c0,"1");
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pmVar12;
  msg_07.m_begin = pvVar10;
  file_07.m_end = (iterator)0x2fc;
  file_07.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_348,
             msg_07);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_350 = "";
  str_07._M_str = "1.9";
  str_07._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_07);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_358,0x2fc,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"1.9\")",
             local_6c0,"1");
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)pmVar12;
  msg_08.m_begin = pvVar10;
  file_08.m_end = (iterator)0x2fd;
  file_08.m_begin = (iterator)&local_368;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_378,
             msg_08);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_380 = "";
  str_08._M_str = "+01.9";
  str_08._M_len = 5;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_08);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_388,0x2fd,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"+01.9\")",
             local_6c0,"1");
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pmVar12;
  msg_09.m_begin = pvVar10;
  file_09.m_end = (iterator)0x2fe;
  file_09.m_begin = (iterator)&local_398;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3a8,
             msg_09);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3b0 = "";
  str_09._M_str = "-1";
  str_09._M_len = 2;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_09);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0xffffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_3b8,0x2fe,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"-1\")",
             local_6c0,"-1");
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)pmVar12;
  msg_10.m_begin = pvVar10;
  file_10.m_end = (iterator)0x2ff;
  file_10.m_begin = (iterator)&local_3c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3d8,
             msg_10);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3e0 = "";
  str_10._M_str = " -1";
  str_10._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_10);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0xffffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_3e8,0x2ff,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\" -1\")",
             local_6c0,"-1");
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pmVar12;
  msg_11.m_begin = pvVar10;
  file_11.m_end = (iterator)0x300;
  file_11.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_408,
             msg_11);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_410 = "";
  str_11._M_str = "-1 ";
  str_11._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_11);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0xffffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_418,0x300,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"-1 \")",
             local_6c0,"-1");
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pmVar12;
  msg_12.m_begin = pvVar10;
  file_12.m_end = (iterator)0x301;
  file_12.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_438,
             msg_12);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_440 = "";
  str_12._M_str = " -1 ";
  str_12._M_len = 4;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_12);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0xffffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_448,0x301,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\" -1 \")",
             local_6c0,"-1");
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = (iterator)pmVar12;
  msg_13.m_begin = pvVar10;
  file_13.m_end = (iterator)0x302;
  file_13.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_468,
             msg_13);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_470 = "";
  str_13._M_str = "+1";
  str_13._M_len = 2;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_13);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_478,0x302,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"+1\")",
             local_6c0,"1");
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pmVar12;
  msg_14.m_begin = pvVar10;
  file_14.m_end = (iterator)0x303;
  file_14.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_498,
             msg_14);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4a0 = "";
  str_14._M_str = " +1";
  str_14._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_14);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_4a8,0x303,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\" +1\")",
             local_6c0,"1");
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)pmVar12;
  msg_15.m_begin = pvVar10;
  file_15.m_end = (iterator)0x304;
  file_15.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c8,
             msg_15);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4d0 = "";
  str_15._M_str = " +1 ";
  str_15._M_len = 4;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_15);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_4d8,0x304,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\" +1 \")",
             local_6c0,"1");
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = (iterator)pmVar12;
  msg_16.m_begin = pvVar10;
  file_16.m_end = (iterator)0x306;
  file_16.m_begin = (iterator)&local_4e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4f8,
             msg_16);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_500 = "";
  str_16._M_str = "+-1";
  str_16._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_16);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_508,0x306,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"+-1\")",
             local_6c0,"0");
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)pmVar12;
  msg_17.m_begin = pvVar10;
  file_17.m_end = (iterator)0x307;
  file_17.m_begin = (iterator)&local_518;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_528,
             msg_17);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_530 = "";
  str_17._M_str = "-+1";
  str_17._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_17);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_538,0x307,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"-+1\")",
             local_6c0,"0");
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = (iterator)pmVar12;
  msg_18.m_begin = pvVar10;
  file_18.m_end = (iterator)0x308;
  file_18.m_begin = (iterator)&local_548;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_558,
             msg_18);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_560 = "";
  str_18._M_str = "++1";
  str_18._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_18);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_568,0x308,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"++1\")",
             local_6c0,"0");
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = (iterator)pmVar12;
  msg_19.m_begin = pvVar10;
  file_19.m_end = (iterator)0x309;
  file_19.m_begin = (iterator)&local_578;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_588,
             msg_19);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_590 = "";
  str_19._M_str = "--1";
  str_19._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_19);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_598,0x309,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"--1\")",
             local_6c0,"0");
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5a0 = "";
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = (iterator)pmVar12;
  msg_20.m_begin = pvVar10;
  file_20.m_end = (iterator)0x30a;
  file_20.m_begin = (iterator)&local_5a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_5b8,
             msg_20);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5c0 = "";
  atoi64_test_pairs._M_t._M_impl._0_4_ =
       LocaleIndependentAtoi<int>((string_view)(ZEXT816(0xc694e1) << 0x40));
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_5c8,0x30a,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"\")",local_6c0
             ,"0");
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)pmVar12;
  msg_21.m_begin = pvVar10;
  file_21.m_end = (iterator)0x30b;
  file_21.m_begin = (iterator)&local_5d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5e8,
             msg_21);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5f0 = "";
  str_20._M_str = "aap";
  str_20._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_20);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_5f8,0x30b,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"aap\")",
             local_6c0,"0");
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_600 = "";
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = (iterator)pmVar12;
  msg_22.m_begin = pvVar10;
  file_22.m_end = (iterator)0x30c;
  file_22.m_begin = (iterator)&local_608;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_618,
             msg_22);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_628 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_620 = "";
  str_21._M_str = "0x1";
  str_21._M_len = 3;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_21);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_628,0x30c,1,2,pmVar12,"LocaleIndependentAtoi<int32_t>(\"0x1\")",
             local_6c0,"0");
  local_638 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_630 = "";
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  local_640 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = (iterator)pmVar12;
  msg_23.m_begin = pvVar10;
  file_23.m_end = (iterator)0x30d;
  file_23.m_begin = (iterator)&local_638;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_648,
             msg_23);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_650 = "";
  str_22._M_str = "-32482348723847471234";
  str_22._M_len = 0x15;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_22);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0x80000000;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_658,0x30d,1,2,pmVar12,
             "LocaleIndependentAtoi<int32_t>(\"-32482348723847471234\")",local_6c0,
             "-2\'147\'483\'647 - 1");
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = (iterator)pmVar12;
  msg_24.m_begin = pvVar10;
  file_24.m_end = (iterator)0x30e;
  file_24.m_begin = (iterator)&local_668;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_678,
             msg_24);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_680 = "";
  str_23._M_str = "32482348723847471234";
  str_23._M_len = 0x14;
  atoi64_test_pairs._M_t._M_impl._0_4_ = LocaleIndependentAtoi<int>(str_23);
  pmVar12 = &atoi64_test_pairs;
  local_6c0._0_4_ = 0x7fffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_688,0x30e,1,2,pmVar12,
             "LocaleIndependentAtoi<int32_t>(\"32482348723847471234\")",local_6c0,"2\'147\'483\'647"
            );
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_690 = "";
  local_6a8 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_6a0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = (iterator)pmVar12;
  msg_25.m_begin = pvVar10;
  file_25.m_end = (iterator)0x310;
  file_25.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6a8,
             msg_25);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6b0 = (_Base_ptr)0xc689eb;
  str_24._M_str = "-9223372036854775809";
  str_24._M_len = 0x14;
  atoi64_test_pairs._M_t._M_impl._0_8_ = LocaleIndependentAtoi<long>(str_24);
  pmVar12 = &atoi64_test_pairs;
  local_6c0 = (undefined1  [8])0x8000000000000000;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_1a8,&local_6b8,0x310,1,2,pmVar12,
             "LocaleIndependentAtoi<int64_t>(\"-9223372036854775809\")",local_6c0,
             "-9\'223\'372\'036\'854\'775\'807LL - 1LL");
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = (iterator)pmVar12;
  msg_26.m_begin = pvVar10;
  file_26.m_end = (iterator)0x311;
  file_26.m_begin = (iterator)&local_6d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6e0,
             msg_26);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6e8 = "";
  str_25._M_str = "-9223372036854775808";
  str_25._M_len = 0x14;
  atoi64_test_pairs._M_t._M_impl._0_8_ = LocaleIndependentAtoi<long>(str_25);
  pmVar12 = &atoi64_test_pairs;
  local_6c0 = (undefined1  [8])0x8000000000000000;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
            (local_1a8,&local_6f0,0x311,1,2,pmVar12,
             "LocaleIndependentAtoi<int64_t>(\"-9223372036854775808\")",local_6c0,
             "-9\'223\'372\'036\'854\'775\'807LL - 1LL");
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = (iterator)pmVar12;
  msg_27.m_begin = pvVar10;
  file_27.m_end = (iterator)0x312;
  file_27.m_begin = (iterator)&local_700;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_710,
             msg_27);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_718 = "";
  str_26._M_str = "9223372036854775807";
  str_26._M_len = 0x13;
  atoi64_test_pairs._M_t._M_impl._0_8_ = LocaleIndependentAtoi<long>(str_26);
  pmVar12 = &atoi64_test_pairs;
  local_6c0 = (undefined1  [8])0x7fffffffffffffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_1a8,&local_720,0x312,1,2,pmVar12,
             "LocaleIndependentAtoi<int64_t>(\"9223372036854775807\")",local_6c0,
             "9\'223\'372\'036\'854\'775\'807");
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_728 = "";
  local_740 = &boost::unit_test::basic_cstring<char_const>::null;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = (iterator)pmVar12;
  msg_28.m_begin = pvVar10;
  file_28.m_end = (iterator)0x313;
  file_28.m_begin = (iterator)&local_730;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_740,
             msg_28);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_748 = "";
  str_27._M_str = "9223372036854775808";
  str_27._M_len = 0x13;
  atoi64_test_pairs._M_t._M_impl._0_8_ = LocaleIndependentAtoi<long>(str_27);
  pmVar12 = &atoi64_test_pairs;
  local_6c0 = (undefined1  [8])0x7fffffffffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_1a8,&local_750,0x313,1,2,pmVar12,
             "LocaleIndependentAtoi<int64_t>(\"9223372036854775808\")",local_6c0,
             "9\'223\'372\'036\'854\'775\'807");
  local_6c0 = (undefined1  [8])0x8000000000000000;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[21],_long,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
              *)local_1a8,(char (*) [21])"-9223372036854775809",(long *)local_6c0);
  local_758 = 0x8000000000000000;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[21],_long_long,_true>
            (&local_180,(char (*) [21])"-9223372036854775808",(longlong *)&local_758);
  local_768[1] = 0x7fffffffffffffff;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[20],_long,_true>
            (&local_158,(char (*) [20])"9223372036854775807",local_768 + 1);
  local_768[0] = 0x7fffffffffffffff;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[20],_long,_true>(&local_130,(char (*) [20])0xc6b48e,local_768);
  local_778[3] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[3],_int,_true>(&local_108,(char (*) [3])"+-",local_778 + 3);
  local_778[2] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_e0,(char (*) [4])"0x1",local_778 + 2);
  local_778[1] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[4],_int,_true>(&local_b8,(char (*) [4])"ox1",local_778 + 1);
  local_778[0] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  ::pair<const_char_(&)[1],_int,_true>(&local_90,(char (*) [1])0xc694e1,local_778);
  __a = &local_77a;
  __l._M_len = 8;
  __l._M_array = (iterator)local_1a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map(&atoi64_test_pairs,__l,&local_779,__a);
  lVar9 = 0x118;
  do {
    std::__cxx11::string::~string((string *)(local_1a8 + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x28);
  p_Var1 = &atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header;
  for (p_Var8 = atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    local_790 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_788 = "";
    local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_798 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_29.m_end = (iterator)pmVar12;
    msg_29.m_begin = (iterator)__a;
    file_29.m_end = (iterator)0x321;
    file_29.m_begin = (iterator)&local_790;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7a0,
               msg_29);
    local_1a8[8] = 0;
    local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_7b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_7a8 = "";
    str_28._M_str = *(char **)(p_Var8 + 1);
    str_28._M_len = (size_t)p_Var8[1]._M_parent;
    local_6c0 = (undefined1  [8])LocaleIndependentAtoi<long>(str_28);
    __a = (allocator_type *)0x2;
    pmVar12 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_6c0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1a8,&local_7b0,0x321,1,2,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)local_6c0,"LocaleIndependentAtoi<int64_t>(pair.first)",p_Var8 + 2,"pair.second");
  }
  for (p_Var8 = atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    local_7c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_7b8 = "";
    local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_30.m_end = (iterator)pmVar12;
    msg_30.m_begin = (iterator)__a;
    file_30.m_end = (iterator)0x326;
    file_30.m_begin = (iterator)&local_7c0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7d0,
               msg_30);
    local_1a8[8] = 0;
    local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
    local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_7e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_7d8 = "";
    str_29._M_str = *(char **)(p_Var8 + 1);
    str_29._M_len = (size_t)p_Var8[1]._M_parent;
    local_6c0 = (undefined1  [8])LocaleIndependentAtoi<long>(str_29);
    local_758 = atoi64_legacy((string *)(p_Var8 + 1));
    __a = (allocator_type *)0x2;
    pmVar12 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)local_6c0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1a8,&local_7e0,0x326,1,2,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *)local_6c0,"LocaleIndependentAtoi<int64_t>(pair.first)",&local_758,
               "atoi64_legacy(pair.first)");
  }
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7e8 = "";
  local_800 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = (iterator)pmVar12;
  msg_31.m_begin = (iterator)__a;
  file_31.m_end = (iterator)0x329;
  file_31.m_begin = (iterator)&local_7f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_800,
             msg_31);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_808 = "";
  str_30._M_str = "-1";
  str_30._M_len = 2;
  local_6c0 = (undefined1  [8])LocaleIndependentAtoi<unsigned_long>(str_30);
  pvVar10 = local_6c0;
  local_758 = local_758 & 0xffffffff00000000;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1a8,&local_810,0x329,1,2,pvVar10,"LocaleIndependentAtoi<uint64_t>(\"-1\")",
             &local_758,"0U");
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar10;
  msg_32.m_begin = pvVar11;
  file_32.m_end = (iterator)0x32a;
  file_32.m_begin = (iterator)&local_820;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_830,
             msg_32);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_838 = "";
  str_31._M_str = "0";
  str_31._M_len = 1;
  local_6c0 = (undefined1  [8])LocaleIndependentAtoi<unsigned_long>(str_31);
  pvVar10 = local_6c0;
  local_758 = local_758 & 0xffffffff00000000;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1a8,&local_840,0x32a,1,2,pvVar10,"LocaleIndependentAtoi<uint64_t>(\"0\")",
             &local_758,"0U");
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_848 = "";
  local_860 = &boost::unit_test::basic_cstring<char_const>::null;
  local_858 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar10;
  msg_33.m_begin = pvVar11;
  file_33.m_end = (iterator)0x32b;
  file_33.m_begin = (iterator)&local_850;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_860,
             msg_33);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_868 = "";
  str_32._M_str = "18446744073709551615";
  str_32._M_len = 0x14;
  local_6c0 = (undefined1  [8])LocaleIndependentAtoi<unsigned_long>(str_32);
  pvVar10 = local_6c0;
  local_758 = 0xffffffffffffffff;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_1a8,&local_870,0x32b,1,2,pvVar10,
             "LocaleIndependentAtoi<uint64_t>(\"18446744073709551615\")",&local_758,
             "18\'446\'744\'073\'709\'551\'615ULL");
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar10;
  msg_34.m_begin = pvVar11;
  file_34.m_end = (iterator)0x32c;
  file_34.m_begin = (iterator)&local_880;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_890,
             msg_34);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_898 = "";
  str_33._M_str = "18446744073709551616";
  str_33._M_len = 0x14;
  local_6c0 = (undefined1  [8])LocaleIndependentAtoi<unsigned_long>(str_33);
  local_758 = 0xffffffffffffffff;
  pvVar10 = (iterator)0x2;
  pvVar11 = local_6c0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
            (local_1a8,&local_8a0,0x32c,1,2,local_6c0,
             "LocaleIndependentAtoi<uint64_t>(\"18446744073709551616\")",&local_758,
             "18\'446\'744\'073\'709\'551\'615ULL");
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = pvVar11;
  msg_35.m_begin = pvVar10;
  file_35.m_end = (iterator)0x32e;
  file_35.m_begin = (iterator)&local_8b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_8c0,
             msg_35);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8c8 = "";
  str_34._M_str = "-2147483649";
  str_34._M_len = 0xb;
  iVar7 = LocaleIndependentAtoi<int>(str_34);
  puVar13 = &local_758;
  local_6c0 = (undefined1  [8])0xffffffff80000000;
  pvVar10 = (iterator)0x2;
  local_758._0_4_ = iVar7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
            (local_1a8,&local_8d0,0x32e,1,2,puVar13,
             "LocaleIndependentAtoi<int32_t>(\"-2147483649\")",local_6c0,"-2\'147\'483\'648LL");
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = (iterator)puVar13;
  msg_36.m_begin = pvVar10;
  file_36.m_end = (iterator)0x32f;
  file_36.m_begin = (iterator)&local_8e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_8f0,
             msg_36);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8f8 = "";
  str_35._M_str = "-2147483648";
  str_35._M_len = 0xb;
  local_758._0_4_ = LocaleIndependentAtoi<int>(str_35);
  local_6c0 = (undefined1  [8])0xffffffff80000000;
  pvVar10 = (iterator)0x2;
  puVar13 = &local_758;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
            (local_1a8,&local_900,0x32f,1,2,&local_758,
             "LocaleIndependentAtoi<int32_t>(\"-2147483648\")",local_6c0,"-2\'147\'483\'648LL");
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = (iterator)puVar13;
  msg_37.m_begin = pvVar10;
  file_37.m_end = (iterator)0x330;
  file_37.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_920,
             msg_37);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_928 = "";
  str_36._M_str = "2147483647";
  str_36._M_len = 10;
  iVar7 = LocaleIndependentAtoi<int>(str_36);
  pvVar10 = local_6c0;
  local_758._0_4_ = 0x7fffffff;
  pvVar11 = (iterator)0x2;
  local_6c0._0_4_ = iVar7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_930,0x330,1,2,pvVar10,"LocaleIndependentAtoi<int32_t>(\"2147483647\")"
             ,&local_758,"2\'147\'483\'647");
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pvVar10;
  msg_38.m_begin = pvVar11;
  file_38.m_end = (iterator)0x331;
  file_38.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_950,
             msg_38);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_958 = "";
  str_37._M_str = "2147483648";
  str_37._M_len = 10;
  local_6c0._0_4_ = LocaleIndependentAtoi<int>(str_37);
  pvVar10 = local_6c0;
  local_758._0_4_ = 0x7fffffff;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_1a8,&local_960,0x331,1,2,pvVar10,"LocaleIndependentAtoi<int32_t>(\"2147483648\")"
             ,&local_758,"2\'147\'483\'647");
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar10;
  msg_39.m_begin = pvVar11;
  file_39.m_end = (iterator)0x333;
  file_39.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_980,
             msg_39);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_988 = "";
  str_38._M_str = "-1";
  str_38._M_len = 2;
  local_6c0._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_38);
  pvVar10 = local_6c0;
  local_758._0_4_ = 0;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_1a8,&local_990,0x333,1,2,pvVar10,"LocaleIndependentAtoi<uint32_t>(\"-1\")",
             &local_758,"0U");
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = pvVar10;
  msg_40.m_begin = pvVar11;
  file_40.m_end = (iterator)0x334;
  file_40.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_9b0,
             msg_40);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9b8 = "";
  str_39._M_str = "0";
  str_39._M_len = 1;
  local_6c0._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_39);
  pvVar10 = local_6c0;
  local_758._0_4_ = 0;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_1a8,&local_9c0,0x334,1,2,pvVar10,"LocaleIndependentAtoi<uint32_t>(\"0\")",
             &local_758,"0U");
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar10;
  msg_41.m_begin = pvVar11;
  file_41.m_end = (iterator)0x335;
  file_41.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_9e0,
             msg_41);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9e8 = "";
  str_40._M_str = "4294967295";
  str_40._M_len = 10;
  local_6c0._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_40);
  pvVar10 = local_6c0;
  local_758._0_4_ = 0xffffffff;
  pvVar11 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_1a8,&local_9f0,0x335,1,2,pvVar10,
             "LocaleIndependentAtoi<uint32_t>(\"4294967295\")",&local_758,"4\'294\'967\'295U");
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = pvVar10;
  msg_42.m_begin = pvVar11;
  file_42.m_end = (iterator)0x336;
  file_42.m_begin = (iterator)&local_a00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_a10,
             msg_42);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a18 = "";
  str_41._M_str = "4294967296";
  str_41._M_len = 10;
  local_6c0._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_41);
  local_758 = CONCAT44(local_758._4_4_,0xffffffff);
  pvVar10 = (iterator)0x2;
  pvVar11 = local_6c0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_1a8,&local_a20,0x336,1,2,local_6c0,
             "LocaleIndependentAtoi<uint32_t>(\"4294967296\")",&local_758,"4\'294\'967\'295U");
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = pvVar11;
  msg_43.m_begin = pvVar10;
  file_43.m_end = (iterator)0x338;
  file_43.m_begin = (iterator)&local_a30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_a40,
             msg_43);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a48 = "";
  str_42._M_str = "-32769";
  str_42._M_len = 6;
  sVar5 = LocaleIndependentAtoi<short>(str_42);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xffff8000;
  pvVar10 = (iterator)0x2;
  local_758._0_2_ = sVar5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
            (local_1a8,&local_a50,0x338,1,2,puVar13,"LocaleIndependentAtoi<int16_t>(\"-32769\")",
             local_6c0,"-32\'768");
  local_a60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a58 = "";
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = (iterator)puVar13;
  msg_44.m_begin = pvVar10;
  file_44.m_end = (iterator)0x339;
  file_44.m_begin = (iterator)&local_a60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a70,
             msg_44);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_a80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a78 = "";
  str_43._M_str = "-32768";
  str_43._M_len = 6;
  local_758._0_2_ = LocaleIndependentAtoi<short>(str_43);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xffff8000;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
            (local_1a8,&local_a80,0x339,1,2,puVar13,"LocaleIndependentAtoi<int16_t>(\"-32768\")",
             local_6c0,"-32\'768");
  local_a90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_a88 = "";
  local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = (iterator)puVar13;
  msg_45.m_begin = pvVar10;
  file_45.m_end = (iterator)0x33a;
  file_45.m_begin = (iterator)&local_a90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_aa0,
             msg_45);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_aa8 = "";
  str_44._M_str = "32767";
  str_44._M_len = 5;
  local_758._0_2_ = LocaleIndependentAtoi<short>(str_44);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0x7fff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
            (local_1a8,&local_ab0,0x33a,1,2,puVar13,"LocaleIndependentAtoi<int16_t>(\"32767\")",
             local_6c0,"32\'767");
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ab8 = "";
  local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ac8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = (iterator)puVar13;
  msg_46.m_begin = pvVar10;
  file_46.m_end = (iterator)0x33b;
  file_46.m_begin = (iterator)&local_ac0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_ad0,
             msg_46);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ae0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ad8 = "";
  str_45._M_str = "32768";
  str_45._M_len = 5;
  local_758._0_2_ = LocaleIndependentAtoi<short>(str_45);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0x7fff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,int>
            (local_1a8,&local_ae0,0x33b,1,2,puVar13,"LocaleIndependentAtoi<int16_t>(\"32768\")",
             local_6c0,"32\'767");
  local_af0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ae8 = "";
  local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = (iterator)puVar13;
  msg_47.m_begin = pvVar10;
  file_47.m_end = (iterator)0x33d;
  file_47.m_begin = (iterator)&local_af0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_b00,
             msg_47);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b08 = "";
  str_46._M_str = "-1";
  str_46._M_len = 2;
  local_758._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_46);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
            (local_1a8,&local_b10,0x33d,1,2,puVar13,"LocaleIndependentAtoi<uint16_t>(\"-1\")",
             local_6c0,"0U");
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b18 = "";
  local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = (iterator)puVar13;
  msg_48.m_begin = pvVar10;
  file_48.m_end = (iterator)0x33e;
  file_48.m_begin = (iterator)&local_b20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_b30,
             msg_48);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b38 = "";
  str_47._M_str = "0";
  str_47._M_len = 1;
  local_758._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_47);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
            (local_1a8,&local_b40,0x33e,1,2,puVar13,"LocaleIndependentAtoi<uint16_t>(\"0\")",
             local_6c0,"0U");
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b48 = "";
  local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = (iterator)puVar13;
  msg_49.m_begin = pvVar10;
  file_49.m_end = (iterator)0x33f;
  file_49.m_begin = (iterator)&local_b50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_b60,
             msg_49);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b68 = "";
  str_48._M_str = "65535";
  str_48._M_len = 5;
  local_758._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_48);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
            (local_1a8,&local_b70,0x33f,1,2,puVar13,"LocaleIndependentAtoi<uint16_t>(\"65535\")",
             local_6c0,"65\'535U");
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b78 = "";
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = (iterator)puVar13;
  msg_50.m_begin = pvVar10;
  file_50.m_end = (iterator)0x340;
  file_50.m_begin = (iterator)&local_b80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_b90,
             msg_50);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_ba0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_b98 = "";
  str_49._M_str = "65536";
  str_49._M_len = 5;
  uVar6 = LocaleIndependentAtoi<unsigned_short>(str_49);
  puVar13 = &local_758;
  local_758 = CONCAT62(local_758._2_6_,uVar6);
  local_6c0._0_4_ = 0xffff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_short,unsigned_int>
            (local_1a8,&local_ba0,0x340,1,2,puVar13,"LocaleIndependentAtoi<uint16_t>(\"65536\")",
             local_6c0,"65\'535U");
  local_bb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ba8 = "";
  local_bc0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bb8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = (iterator)puVar13;
  msg_51.m_begin = pvVar10;
  file_51.m_end = (iterator)0x342;
  file_51.m_begin = (iterator)&local_bb0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_bc0,
             msg_51);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_bd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_bc8 = "";
  str_50._M_str = "-129";
  str_50._M_len = 4;
  cVar3 = LocaleIndependentAtoi<signed_char>(str_50);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xffffff80;
  pvVar10 = (iterator)0x2;
  local_758._0_1_ = cVar3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
            (local_1a8,&local_bd0,0x342,1,2,puVar13,"LocaleIndependentAtoi<int8_t>(\"-129\")",
             local_6c0,"-128");
  local_be0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_52.m_end = (iterator)puVar13;
  msg_52.m_begin = pvVar10;
  file_52.m_end = (iterator)0x343;
  file_52.m_begin = (iterator)&local_be0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_bf0,
             msg_52);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_bf8 = "";
  str_51._M_str = "-128";
  str_51._M_len = 4;
  local_758._0_1_ = LocaleIndependentAtoi<signed_char>(str_51);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xffffff80;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
            (local_1a8,&local_c00,0x343,1,2,puVar13,"LocaleIndependentAtoi<int8_t>(\"-128\")",
             local_6c0,"-128");
  local_c10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_53.m_end = (iterator)puVar13;
  msg_53.m_begin = pvVar10;
  file_53.m_end = (iterator)0x344;
  file_53.m_begin = (iterator)&local_c10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_c20,
             msg_53);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c28 = "";
  str_52._M_str = "127";
  str_52._M_len = 3;
  local_758._0_1_ = LocaleIndependentAtoi<signed_char>(str_52);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0x7f;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
            (local_1a8,&local_c30,0x344,1,2,puVar13,"LocaleIndependentAtoi<int8_t>(\"127\")",
             local_6c0,"127");
  local_c40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_54.m_end = (iterator)puVar13;
  msg_54.m_begin = pvVar10;
  file_54.m_end = (iterator)0x345;
  file_54.m_begin = (iterator)&local_c40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_c50,
             msg_54);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c58 = "";
  str_53._M_str = "128";
  str_53._M_len = 3;
  local_758._0_1_ = LocaleIndependentAtoi<signed_char>(str_53);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0x7f;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,signed_char,int>
            (local_1a8,&local_c60,0x345,1,2,puVar13,"LocaleIndependentAtoi<int8_t>(\"128\")",
             local_6c0,"127");
  local_c70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_55.m_end = (iterator)puVar13;
  msg_55.m_begin = pvVar10;
  file_55.m_end = (iterator)0x347;
  file_55.m_begin = (iterator)&local_c70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_c80,
             msg_55);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_c90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c88 = "";
  str_54._M_str = "-1";
  str_54._M_len = 2;
  local_758._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_54);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
            (local_1a8,&local_c90,0x347,1,2,puVar13,"LocaleIndependentAtoi<uint8_t>(\"-1\")",
             local_6c0,"0U");
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_56.m_end = (iterator)puVar13;
  msg_56.m_begin = pvVar10;
  file_56.m_end = (iterator)0x348;
  file_56.m_begin = (iterator)&local_ca0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_cb0,
             msg_56);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_cc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_cb8 = "";
  str_55._M_str = "0";
  str_55._M_len = 1;
  local_758._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_55);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
            (local_1a8,&local_cc0,0x348,1,2,puVar13,"LocaleIndependentAtoi<uint8_t>(\"0\")",
             local_6c0,"0U");
  local_cd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_cc8 = "";
  local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cd8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_57.m_end = (iterator)puVar13;
  msg_57.m_begin = pvVar10;
  file_57.m_end = (iterator)0x349;
  file_57.m_begin = (iterator)&local_cd0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_ce0,
             msg_57);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_cf0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_ce8 = "";
  str_56._M_str = "255";
  str_56._M_len = 3;
  local_758._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_56);
  puVar13 = &local_758;
  local_6c0._0_4_ = 0xff;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
            (local_1a8,&local_cf0,0x349,1,2,puVar13,"LocaleIndependentAtoi<uint8_t>(\"255\")",
             local_6c0,"255U");
  local_d00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_cf8 = "";
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_58.m_end = (iterator)puVar13;
  msg_58.m_begin = pvVar10;
  file_58.m_end = (iterator)0x34a;
  file_58.m_begin = (iterator)&local_d00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_d10,
             msg_58);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_1a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_d20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_d18 = "";
  str_57._M_str = "256";
  str_57._M_len = 3;
  uVar4 = LocaleIndependentAtoi<unsigned_char>(str_57);
  local_758 = CONCAT71(local_758._1_7_,uVar4);
  local_6c0._0_4_ = 0xff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_int>
            (local_1a8,&local_d20,0x34a,1,2,&local_758,"LocaleIndependentAtoi<uint8_t>(\"256\")",
             local_6c0,"255U");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&atoi64_test_pairs._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LocaleIndependentAtoi)
{
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("01234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1234"), -1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" 1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1 "), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1a"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+01.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1 "), 1);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+-1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-+1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("++1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("--1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(""), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("aap"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0x1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-32482348723847471234"), -2'147'483'647 - 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("32482348723847471234"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775809"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775808"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775807"), 9'223'372'036'854'775'807);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775808"), 9'223'372'036'854'775'807);

    std::map<std::string, int64_t> atoi64_test_pairs = {
        {"-9223372036854775809", std::numeric_limits<int64_t>::min()},
        {"-9223372036854775808", -9'223'372'036'854'775'807LL - 1LL},
        {"9223372036854775807", 9'223'372'036'854'775'807},
        {"9223372036854775808", std::numeric_limits<int64_t>::max()},
        {"+-", 0},
        {"0x1", 0},
        {"ox1", 0},
        {"", 0},
    };

    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), pair.second);
    }

    // Ensure legacy compatibility with previous versions of Bitcoin Core's atoi64
    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), atoi64_legacy(pair.first));
    }

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551615"), 18'446'744'073'709'551'615ULL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551616"), 18'446'744'073'709'551'615ULL);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483649"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483648"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483647"), 2'147'483'647);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483648"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967295"), 4'294'967'295U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967296"), 4'294'967'295U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32769"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32768"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32767"), 32'767);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32768"), 32'767);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65535"), 65'535U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65536"), 65'535U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-129"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-128"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("127"), 127);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("128"), 127);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("255"), 255U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("256"), 255U);
}